

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

void __thiscall cnn::ComputationGraph::~ComputationGraph(ComputationGraph *this)

{
  clear(this);
  if (this->ee != (ExecutionEngine *)0x0) {
    (*this->ee->_vptr_ExecutionEngine[1])();
  }
  n_hgs = n_hgs + -1;
  std::_Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::~_Vector_base
            (&(this->parameter_nodes).
              super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>);
  std::_Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>::~_Vector_base
            ((_Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)this);
  return;
}

Assistant:

ComputationGraph::~ComputationGraph() {
  this->clear();
  delete ee;
  --n_hgs;
}